

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

dgEdge * __thiscall dgMeshEffect::InsertEdgeVertex(dgMeshEffect *this,dgEdge *edge,HaF64 param)

{
  int iVar1;
  dgEdge *pdVar2;
  dgEdge *pdVar3;
  dgEdge *pdVar4;
  dgEdge *pdVar5;
  undefined1 auVar6 [16];
  HaU64 HVar7;
  HaU64 HVar8;
  dgVertexAtribute attrTwin;
  dgVertexAtribute attrEdge;
  dgVertexAtribute local_f8;
  dgVertexAtribute local_90;
  
  pdVar2 = edge->m_twin;
  InterpolateEdge(&local_90,this,edge,param);
  InterpolateEdge(&local_f8,this,pdVar2,(HaF64)(1.0 - (double)param));
  local_f8.m_vertex.super_dgTemplateVector<double>.m_x =
       local_90.m_vertex.super_dgTemplateVector<double>.m_x;
  local_f8.m_vertex.super_dgTemplateVector<double>.m_y =
       local_90.m_vertex.super_dgTemplateVector<double>.m_y;
  local_f8.m_vertex.super_dgTemplateVector<double>.m_z =
       local_90.m_vertex.super_dgTemplateVector<double>.m_z;
  local_f8.m_vertex.super_dgTemplateVector<double>.m_w =
       local_90.m_vertex.super_dgTemplateVector<double>.m_w;
  auVar6 = vcvtdq2pd_avx(ZEXT416((uint)(int)(double)local_90.m_material));
  AddPoint(this,(HaF64 *)&local_90,
           (int)(double)local_90.m_material - (uint)((double)local_90.m_material < auVar6._0_8_));
  AddAtribute(this,&local_f8);
  HVar7 = edge->m_userData;
  HVar8 = pdVar2->m_userData;
  pdVar3 = pdVar2->m_next;
  pdVar4 = edge->m_next;
  pdVar5 = edge->m_prev;
  pdVar2 = pdVar2->m_prev;
  dgPolyhedra::SpliteEdge
            (&this->super_dgPolyhedra,*(int *)&(this->super_dgRefCounter).field_0xc + -1,edge);
  iVar1 = this->m_atribCount;
  pdVar4->m_prev->m_userData = (long)iVar1 - 2;
  pdVar4 = pdVar5->m_next;
  pdVar4->m_userData = (long)(int)HVar7;
  pdVar3->m_prev->m_userData = (long)iVar1 - 1;
  pdVar2->m_next->m_userData = (long)(int)HVar8;
  return pdVar4;
}

Assistant:

dgEdge* dgMeshEffect::InsertEdgeVertex (dgEdge* const edge, hacd::HaF64 param)
{

	dgEdge* const twin = edge->m_twin;
	dgVertexAtribute attrEdge (InterpolateEdge (edge, param));
	dgVertexAtribute attrTwin (InterpolateEdge (twin, hacd::HaF32 (1.0f) - param));

	attrTwin.m_vertex = attrEdge.m_vertex;
	AddPoint(&attrEdge.m_vertex.m_x, dgFastInt (attrEdge.m_material));
	AddAtribute (attrTwin);

	hacd::HaI32 edgeAttrV0 = hacd::HaI32 (edge->m_userData);
	hacd::HaI32 twinAttrV0 = hacd::HaI32 (twin->m_userData);

	dgEdge* const faceA0 = edge->m_next;
	dgEdge* const faceA1 = edge->m_prev;
	dgEdge* const faceB0 = twin->m_next;
	dgEdge* const faceB1 = twin->m_prev;

//	SpliteEdgeAndTriangulate (m_pointCount - 1, edge);
	SpliteEdge (m_pointCount - 1, edge);

	faceA0->m_prev->m_userData = hacd::HaU64 (m_atribCount - 2);
	faceA1->m_next->m_userData = hacd::HaU64 (edgeAttrV0);

	faceB0->m_prev->m_userData = hacd::HaU64 (m_atribCount - 1);
	faceB1->m_next->m_userData = hacd::HaU64 (twinAttrV0);

	return faceA1->m_next;
}